

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,bool raii)

{
  byte bVar1;
  size_type sVar2;
  reference pvVar3;
  allocator<char> local_61;
  undefined4 local_60;
  undefined1 local_50 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams;
  bool raii_local;
  bool definition_local;
  size_t initialSkipCount_local;
  CommandData *commandData_local;
  string *name_local;
  VulkanHppGenerator *this_local;
  
  returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = raii;
  returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = definition;
  determineReturnParams
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_50,this,
             &commandData->params);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_50);
  bVar1 = returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_;
  switch(sVar2) {
  case 0:
    generateCommandResultWithErrors0Return
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,
               (bool)(returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
               (bool)(returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
    break;
  case 1:
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_50,0);
    generateCommandResultSingleSuccessWithErrors1Return
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,(bool)(bVar1 & 1),
               *pvVar3,(bool)(returnParams.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
    break;
  case 2:
    generateCommandResultSingleSuccessWithErrors2Return
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,
               (bool)(returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_50,
               (bool)(returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
    break;
  case 3:
    generateCommandResultSingleSuccessWithErrors3Return
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,
               (bool)(returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_50,
               (bool)(returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_61);
    std::allocator<char>::~allocator(&local_61);
  }
  local_60 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, bool raii ) const
{
  std::vector<size_t> returnParams = determineReturnParams( commandData.params );
  switch ( returnParams.size() )
  {
    case 0 : return generateCommandResultWithErrors0Return( name, commandData, initialSkipCount, definition, raii );
    case 1 : return generateCommandResultSingleSuccessWithErrors1Return( name, commandData, initialSkipCount, definition, returnParams[0], raii );
    case 2 : return generateCommandResultSingleSuccessWithErrors2Return( name, commandData, initialSkipCount, definition, returnParams, raii );
    case 3 : return generateCommandResultSingleSuccessWithErrors3Return( name, commandData, initialSkipCount, definition, returnParams, raii );
    default: break;
  }
  return "";
}